

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O0

void __thiscall
brotli::BlockEncoder::StoreSymbol
          (BlockEncoder *this,size_t symbol,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  const_reference pvVar2;
  byte *pbVar3;
  size_type __n;
  reference pvVar4;
  size_t ix;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t symbol_local;
  BlockEncoder *this_local;
  
  if (this->block_len_ == 0) {
    this->block_ix_ = this->block_ix_ + 1;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (this->block_lengths_,this->block_ix_);
    this->block_len_ = (ulong)*pvVar2;
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (this->block_types_,this->block_ix_);
    this->entropy_ix_ = (ulong)*pbVar3 * this->alphabet_size_;
    StoreBlockSwitch(&this->block_split_code_,this->block_ix_,storage_ix,storage);
  }
  this->block_len_ = this->block_len_ - 1;
  __n = this->entropy_ix_ + symbol;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->depths_,__n);
  bVar1 = *pbVar3;
  pvVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     (&this->bits_,__n);
  WriteBits((ulong)bVar1,(ulong)*pvVar4,storage_ix,storage);
  return;
}

Assistant:

void StoreSymbol(size_t symbol, size_t* storage_ix, uint8_t* storage) {
    if (block_len_ == 0) {
      ++block_ix_;
      block_len_ = block_lengths_[block_ix_];
      entropy_ix_ = block_types_[block_ix_] * alphabet_size_;
      StoreBlockSwitch(block_split_code_, block_ix_, storage_ix, storage);
    }
    --block_len_;
    size_t ix = entropy_ix_ + symbol;
    WriteBits(depths_[ix], bits_[ix], storage_ix, storage);
  }